

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O0

void __thiscall
draco::AttributesEncoder::SetAttributeIds
          (AttributesEncoder *this,vector<int,_std::allocator<int>_> *point_attribute_ids)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator cVar2;
  reference piVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  int32_t att_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b0670);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b067d);
  this_00 = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  cVar2 = std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd4 = *piVar3;
    AddAttributeId((AttributesEncoder *)this_00._M_current,
                   (int32_t)((ulong)cVar2._M_current >> 0x20));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void SetAttributeIds(const std::vector<int32_t> &point_attribute_ids) {
    point_attribute_ids_.clear();
    point_attribute_to_local_id_map_.clear();
    for (int32_t att_id : point_attribute_ids) {
      AddAttributeId(att_id);
    }
  }